

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::erase(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        *this,key_type *key)

{
  long lVar1;
  ulong uVar2;
  size_t idx;
  uint uVar3;
  Node *pNVar4;
  
  uVar2 = (ulong)*key * -0x3f1b720669c11bf9;
  uVar3 = (((uint)(uVar2 >> 0x20) & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f)) + this->mInfoInc;
  idx = (uVar2 << 0x20 | uVar2 >> 0x20) >> 5 & this->mMask;
  pNVar4 = this->mKeyVals + idx;
  while ((uVar3 != this->mInfo[idx] || (*key != (pNVar4->mData).first))) {
    uVar3 = uVar3 + this->mInfoInc;
    lVar1 = idx + 1;
    idx = idx + 1;
    pNVar4 = pNVar4 + 1;
    if (this->mInfo[lVar1] < uVar3) {
      return 0;
    }
  }
  shiftDown(this,idx);
  this->mNumElements = this->mNumElements - 1;
  return 1;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }